

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_lm_eval.c
# Opt level: O0

int main(int argc,char **argv)

{
  cmd_ln_t *config_00;
  logmath_t *lmath_00;
  char *pcVar1;
  ngram_model_t *model;
  char *text_00;
  double dVar2;
  double dVar3;
  char *text;
  char *lsnfn;
  char *probdefn;
  char *lmfn;
  logmath_t *lmath;
  ngram_model_t *lm;
  cmd_ln_t *config;
  char **argv_local;
  int argc_local;
  
  config_00 = cmd_ln_parse_r((ps_config_t *)0x0,defn,argc,argv,1);
  if (config_00 == (cmd_ln_t *)0x0) {
    err_set_loglevel(ERR_INFO);
    cmd_ln_log_help_r((ps_config_t *)0x0,defn);
    argv_local._4_4_ = 1;
  }
  else {
    verbose = ps_config_bool(config_00,"verbose");
    dVar2 = ps_config_float(config_00,"logbase");
    lmath_00 = logmath_init((float64)dVar2,0,0);
    if (lmath_00 == (logmath_t *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
              ,0x12f,"Failed to initialize log math\n");
      exit(1);
    }
    pcVar1 = ps_config_str(config_00,"lm");
    if ((pcVar1 == (char *)0x0) ||
       (model = ngram_model_read(config_00,pcVar1,NGRAM_AUTO,lmath_00),
       model == (ngram_model_t *)0x0)) {
      pcVar1 = ps_config_str(config_00,"lm");
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
              ,0x138,"Failed to load language model from %s\n",pcVar1);
      exit(1);
    }
    pcVar1 = ps_config_str(config_00,"probdef");
    if (pcVar1 != (char *)0x0) {
      ngram_model_read_classdef(model,pcVar1);
    }
    dVar2 = ps_config_float(config_00,"lw");
    dVar3 = ps_config_float(config_00,"wip");
    ngram_model_apply_weights(model,(float32)(float)dVar2,(float32)(float)dVar3);
    pcVar1 = ps_config_str(config_00,"lsn");
    text_00 = ps_config_str(config_00,"text");
    if (pcVar1 == (char *)0x0) {
      if (text_00 != (char *)0x0) {
        evaluate_string(model,lmath_00,text_00);
      }
    }
    else {
      evaluate_file(model,lmath_00,pcVar1);
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
	cmd_ln_t *config;
	ngram_model_t *lm = NULL;
	logmath_t *lmath;
	const char *lmfn, *probdefn, *lsnfn, *text;

	if ((config = cmd_ln_parse_r(NULL, defn, argc, argv, TRUE)) == NULL) {
            /* This probably just means that we got no arguments. */
            err_set_loglevel(ERR_INFO);
            cmd_ln_log_help_r(NULL, defn);
            return 1;
        }

        verbose = ps_config_bool(config, "verbose");

	/* Create log math object. */
	if ((lmath = logmath_init
	     (ps_config_float(config, "logbase"), 0, 0)) == NULL) {
		E_FATAL("Failed to initialize log math\n");
	}

	/* Load the language model. */
	lmfn = ps_config_str(config, "lm");
	if (lmfn == NULL
	    || (lm = ngram_model_read(config, lmfn,
				      NGRAM_AUTO, lmath)) == NULL) {
		E_FATAL("Failed to load language model from %s\n",
			ps_config_str(config, "lm"));
	}
        if ((probdefn = ps_config_str(config, "probdef")) != NULL)
            ngram_model_read_classdef(lm, probdefn);
        ngram_model_apply_weights(lm,
                                  ps_config_float(config, "lw"),
                                  ps_config_float(config, "wip"));

	/* Now evaluate some text. */
	lsnfn = ps_config_str(config, "lsn");
	text = ps_config_str(config, "text");
	if (lsnfn) {
		evaluate_file(lm, lmath, lsnfn);
	}
	else if (text) {
		evaluate_string(lm, lmath, text);
	}

	return 0;
}